

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,curl_llist **list_ptr)

{
  curl_llist *list;
  int iVar1;
  char *p;
  char *server_name;
  curl_llist *new_list;
  curl_llist *old_list;
  curl_llist **list_ptr_local;
  char **servers_local;
  
  list = *list_ptr;
  server_name = (char *)0x0;
  if (servers != (char **)0x0) {
    server_name = (char *)Curl_llist_alloc(server_blacklist_llist_dtor);
    list_ptr_local = (curl_llist **)servers;
    if ((curl_llist *)server_name == (curl_llist *)0x0) {
      return CURLM_OUT_OF_MEMORY;
    }
    for (; *list_ptr_local != (curl_llist *)0x0; list_ptr_local = list_ptr_local + 1) {
      p = (*Curl_cstrdup)((char *)*list_ptr_local);
      if (p == (char *)0x0) {
        Curl_llist_destroy((curl_llist *)server_name,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
      iVar1 = Curl_llist_insert_next((curl_llist *)server_name,((curl_llist *)server_name)->tail,p);
      if (iVar1 == 0) {
        Curl_llist_destroy((curl_llist *)server_name,(void *)0x0);
        (*Curl_cfree)(p);
        return CURLM_OUT_OF_MEMORY;
      }
    }
  }
  if (list != (curl_llist *)0x0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  *list_ptr = (curl_llist *)server_name;
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,
                                             struct curl_llist **list_ptr)
{
  struct curl_llist *old_list = *list_ptr;
  struct curl_llist *new_list = NULL;

  if(servers) {
    new_list = Curl_llist_alloc((curl_llist_dtor) server_blacklist_llist_dtor);
    if(!new_list)
      return CURLM_OUT_OF_MEMORY;

    /* Parse the URLs and populate the list */
    while(*servers) {
      char *server_name;

      server_name = strdup(*servers);
      if(!server_name) {
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      if(!Curl_llist_insert_next(new_list, new_list->tail, server_name)) {
        Curl_llist_destroy(new_list, NULL);
        Curl_safefree(server_name);
        return CURLM_OUT_OF_MEMORY;
      }

      servers++;
    }
  }

  /* Free the old list */
  if(old_list) {
    Curl_llist_destroy(old_list, NULL);
  }

  /* This might be NULL if sites == NULL, i.e the blacklist is cleared */
  *list_ptr = new_list;

  return CURLM_OK;
}